

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_document_append_sequence_item(yaml_document_t *document,int sequence,int item)

{
  yaml_node_t *pyVar1;
  int *piVar2;
  int iVar3;
  anon_struct_4_1_a7dec128 context;
  int item_local;
  int sequence_local;
  yaml_document_t *document_local;
  
  if (document == (yaml_document_t *)0x0) {
    __assert_fail("document",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x53e,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
  }
  if ((sequence < 1) || ((document->nodes).top < (document->nodes).start + sequence)) {
    __assert_fail("sequence > 0 && document->nodes.start + sequence <= document->nodes.top",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x540,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
  }
  if ((document->nodes).start[sequence + -1].type != YAML_SEQUENCE_NODE) {
    __assert_fail("document->nodes.start[sequence-1].type == YAML_SEQUENCE_NODE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x542,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
  }
  if ((0 < item) && ((document->nodes).start + item <= (document->nodes).top)) {
    if (((document->nodes).start[sequence + -1].data.sequence.items.top ==
         (yaml_node_item_t *)(document->nodes).start[sequence + -1].data.scalar.length) &&
       (iVar3 = yaml_stack_extend((void **)&(document->nodes).start[sequence + -1].data,
                                  (void **)((long)&(document->nodes).start[sequence + -1].data +
                                           0x10),
                                  (void **)&(document->nodes).start[sequence + -1].data.scalar.
                                            length), iVar3 == 0)) {
      document_local._4_4_ = 0;
    }
    else {
      pyVar1 = (document->nodes).start;
      piVar2 = pyVar1[sequence + -1].data.sequence.items.top;
      pyVar1[sequence + -1].data.sequence.items.top = piVar2 + 1;
      *piVar2 = item;
      document_local._4_4_ = 1;
    }
    return document_local._4_4_;
  }
  __assert_fail("item > 0 && document->nodes.start + item <= document->nodes.top",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x544,"int yaml_document_append_sequence_item(yaml_document_t *, int, int)");
}

Assistant:

YAML_DECLARE(int)
yaml_document_append_sequence_item(yaml_document_t *document,
        int sequence, int item)
{
    struct {
        yaml_error_type_t error;
    } context;

    assert(document);       /* Non-NULL document is required. */
    assert(sequence > 0
            && document->nodes.start + sequence <= document->nodes.top);
                            /* Valid sequence id is required. */
    assert(document->nodes.start[sequence-1].type == YAML_SEQUENCE_NODE);
                            /* A sequence node is required. */
    assert(item > 0 && document->nodes.start + item <= document->nodes.top);
                            /* Valid item id is required. */

    if (!PUSH(&context,
                document->nodes.start[sequence-1].data.sequence.items, item))
        return 0;

    return 1;
}